

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.h
# Opt level: O0

BLOCK_SIZE convert_length_to_bsize(int length)

{
  int length_local;
  undefined1 local_1;
  
  if (length == 4) {
    local_1 = BLOCK_4X4;
  }
  else if (length == 8) {
    local_1 = BLOCK_8X8;
  }
  else if (length == 0x10) {
    local_1 = BLOCK_16X16;
  }
  else if (length == 0x20) {
    local_1 = BLOCK_32X32;
  }
  else if (length == 0x40) {
    local_1 = BLOCK_64X64;
  }
  else {
    local_1 = BLOCK_16X16;
  }
  return local_1;
}

Assistant:

static inline BLOCK_SIZE convert_length_to_bsize(int length) {
  switch (length) {
    case 64: return BLOCK_64X64;
    case 32: return BLOCK_32X32;
    case 16: return BLOCK_16X16;
    case 8: return BLOCK_8X8;
    case 4: return BLOCK_4X4;
    default:
      assert(0 && "Invalid block size for tpl model");
      return BLOCK_16X16;
  }
}